

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeConstraints::applyConstraints(FluctuatingChargeConstraints *this)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer ppAVar6;
  pointer pdVar7;
  pointer piVar8;
  Molecule *pMVar9;
  pointer ppAVar10;
  long lVar11;
  pointer ppAVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  Atom *pAVar17;
  int iVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  MoleculeIterator i;
  MoleculeIterator local_28;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  if (this->hasFlucQ_ == true) {
    local_28._M_node = (_Base_ptr)0x0;
    if (this->constrainRegions_ == true) {
      pdVar4 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar7 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start; pdVar7 != pdVar4; pdVar7 = pdVar7 + 1) {
        *pdVar7 = 0.0;
      }
      piVar5 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar8 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar5; piVar8 = piVar8 + 1) {
        *piVar8 = 0;
      }
    }
    pMVar9 = SimInfo::beginMolecule(this->info_,&local_28);
    dVar21 = 0.0;
    iVar18 = 0;
    while (pMVar9 != (Molecule *)0x0) {
      if (pMVar9->constrainTotalCharge_ == false) {
        ppAVar10 = (pMVar9->fluctuatingCharges_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar6 = (pMVar9->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar10 == ppAVar6) {
          pAVar17 = (Atom *)0x0;
        }
        else {
          pAVar17 = *ppAVar10;
        }
        uVar15 = pMVar9->molStamp_->region_;
        bVar2 = this->constrainRegions_;
        piVar8 = (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        while (ppAVar10 = ppAVar10 + 1, pAVar17 != (Atom *)0x0) {
          dVar19 = *(double *)
                    (*(long *)((long)&(((pAVar17->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar17->super_StuntDouble).storage_) +
                    (long)(pAVar17->super_StuntDouble).localIndex_ * 8);
          if ((-1 < (int)uVar15 & bVar2) == 0) {
            dVar21 = dVar21 + dVar19;
            iVar18 = iVar18 + 1;
          }
          else {
            iVar3 = piVar8[uVar15];
            pdVar7[iVar3] = dVar19 + pdVar7[iVar3];
            piVar1 = piVar5 + iVar3;
            *piVar1 = *piVar1 + 1;
          }
          if (ppAVar10 == ppAVar6) {
            pAVar17 = (Atom *)0x0;
          }
          else {
            pAVar17 = *ppAVar10;
          }
        }
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_28);
    }
    if (this->constrainRegions_ == true) {
      pdVar7 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar8 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < (ulong)((long)pdVar4 - (long)pdVar7 >> 3);
          uVar15 = uVar15 + 1) {
        pdVar7[uVar16] = pdVar7[uVar16] / (double)piVar8[uVar16];
      }
    }
    pMVar9 = SimInfo::beginMolecule(this->info_,&local_28);
    while (pMVar9 != (Molecule *)0x0) {
      if (pMVar9->constrainTotalCharge_ == true) {
        ppAVar10 = (pMVar9->fluctuatingCharges_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar6 = (pMVar9->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        dVar19 = 0.0;
        ppAVar12 = ppAVar10;
        if (ppAVar10 != ppAVar6) goto LAB_001e4cb3;
        pAVar17 = (Atom *)0x0;
        while (pAVar17 != (Atom *)0x0) {
          dVar19 = dVar19 + *(double *)
                             (*(long *)((long)&(((pAVar17->super_StuntDouble).snapshotMan_)->
                                                currentSnapshot_->atomData).flucQFrc.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start +
                                       (pAVar17->super_StuntDouble).storage_) +
                             (long)(pAVar17->super_StuntDouble).localIndex_ * 8);
          ppAVar12 = ppAVar12 + 1;
          pAVar17 = (Atom *)0x0;
          if (ppAVar12 != ppAVar6) {
LAB_001e4cb3:
            pAVar17 = *ppAVar12;
          }
        }
        lVar13 = (long)ppAVar6 - (long)ppAVar10 >> 3;
        auVar20._8_4_ = (int)((long)ppAVar6 - (long)ppAVar10 >> 0x23);
        auVar20._0_8_ = lVar13;
        auVar20._12_4_ = 0x45300000;
        if (ppAVar6 != ppAVar10) goto LAB_001e4d27;
        pAVar17 = (Atom *)0x0;
        while (pAVar17 != (Atom *)0x0) {
          lVar14 = (long)(pAVar17->super_StuntDouble).localIndex_;
          lVar11 = *(long *)((long)&(((pAVar17->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).flucQFrc.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                            (pAVar17->super_StuntDouble).storage_);
          *(double *)(lVar11 + lVar14 * 8) =
               *(double *)(lVar11 + lVar14 * 8) -
               dVar19 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
          ppAVar10 = ppAVar10 + 1;
          pAVar17 = (Atom *)0x0;
          if (ppAVar10 != ppAVar6) {
LAB_001e4d27:
            pAVar17 = *ppAVar10;
          }
        }
      }
      else {
        lVar13 = (long)pMVar9->molStamp_->region_;
        if ((lVar13 < 0) || (this->constrainRegions_ == false)) {
          ppAVar10 = (pMVar9->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar9->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar10 != ppAVar6) goto LAB_001e4c3c;
          pAVar17 = (Atom *)0x0;
          while (pAVar17 != (Atom *)0x0) {
            lVar11 = (long)(pAVar17->super_StuntDouble).localIndex_;
            lVar13 = *(long *)((long)&(((pAVar17->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar17->super_StuntDouble).storage_);
            *(double *)(lVar13 + lVar11 * 8) =
                 *(double *)(lVar13 + lVar11 * 8) - dVar21 / (double)iVar18;
            ppAVar10 = ppAVar10 + 1;
            pAVar17 = (Atom *)0x0;
            if (ppAVar10 != ppAVar6) {
LAB_001e4c3c:
              pAVar17 = *ppAVar10;
            }
          }
        }
        else {
          dVar19 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13]];
          ppAVar10 = (pMVar9->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar6 = (pMVar9->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar10 != ppAVar6) goto LAB_001e4c7e;
          pAVar17 = (Atom *)0x0;
          while (pAVar17 != (Atom *)0x0) {
            lVar11 = (long)(pAVar17->super_StuntDouble).localIndex_;
            lVar13 = *(long *)((long)&(((pAVar17->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar17->super_StuntDouble).storage_);
            *(double *)(lVar13 + lVar11 * 8) = *(double *)(lVar13 + lVar11 * 8) - dVar19;
            ppAVar10 = ppAVar10 + 1;
            pAVar17 = (Atom *)0x0;
            if (ppAVar10 != ppAVar6) {
LAB_001e4c7e:
              pAVar17 = *ppAVar10;
            }
          }
        }
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_28);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::applyConstraints() {
    if (!initialized_) initialize();
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    RealType frc, systemFrc, molFrc, regionFrc;
    int systemCharges;

    // accumulate the system fluctuating charge forces, but we have
    // separate constraints for any charges in defined regions and for
    // molecules with constrained charges:

    systemFrc     = 0.0;
    systemCharges = 0;
    if (constrainRegions_) {
      std::fill(regionForce_.begin(), regionForce_.end(), 0.0);
      std::fill(regionCharges_.begin(), regionCharges_.end(), 0);
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (!mol->constrainTotalCharge()) {
        int region = mol->getRegion();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          frc = atom->getFlucQFrc();
          if (constrainRegions_ && region >= 0) {
            regionForce_[regionKeys_[region]] += frc;
            regionCharges_[regionKeys_[region]] += 1;
          } else {
            systemFrc += frc;
            systemCharges += 1;
          }
        }
      }
    }

#ifdef IS_MPI
    // in parallel, we need to add up the contributions from all
    // processors:
    MPI_Allreduce(MPI_IN_PLACE, &systemFrc, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &systemCharges, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    if (constrainRegions_) {
      MPI_Allreduce(MPI_IN_PLACE, &regionForce_[0], regionForce_.size(),
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &regionCharges_[0], regionCharges_.size(),
                    MPI_INT, MPI_SUM, MPI_COMM_WORLD);
    }

#endif

    // divide by the total number of fluctuating charges:
    systemFrc /= systemCharges;

    // do the same in the regions:
    if (constrainRegions_) {
      for (unsigned int i = 0; i < regionForce_.size(); ++i) {
        regionForce_[i] /= regionCharges_[i];
      }
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      molFrc = 0.0;

      if (mol->constrainTotalCharge()) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          molFrc += atom->getFlucQFrc();
        }
        molFrc /= mol->getNFluctuatingCharges();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          frc = atom->getFlucQFrc() - molFrc;
          atom->setFlucQFrc(frc);
        }
      } else {
        int region = mol->getRegion();

        regionFrc = 0.0;
        if (constrainRegions_ && region >= 0) {
          regionFrc = regionForce_[regionKeys_[region]];

          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            frc = atom->getFlucQFrc() - regionFrc;
            atom->setFlucQFrc(frc);
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            frc = atom->getFlucQFrc() - systemFrc;
            atom->setFlucQFrc(frc);
          }
        }
      }
    }
  }